

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  StkId pTVar3;
  lua_State *L_00;
  uint uVar4;
  int iVar5;
  TValue *o1;
  char *s;
  char *pcVar6;
  char *e;
  char *pcVar7;
  ushort **ppuVar8;
  TValue *pTVar9;
  int iVar10;
  TValue *pTVar11;
  ulong uVar12;
  bool bVar14;
  size_t srcl;
  size_t l;
  MatchState ms;
  luaL_Buffer b;
  size_t local_2290;
  ulong local_2288;
  lua_State *local_2280;
  char *local_2278;
  lua_Integer local_2270;
  MatchState local_2268;
  luaL_Buffer local_2048;
  ulong uVar13;
  
  s = luaL_checklstring(L,1,&local_2290);
  bVar14 = false;
  pcVar6 = luaL_checklstring(L,2,(size_t *)0x0);
  pTVar11 = L->base + 2;
  if (pTVar11 != &luaO_nilobject_ && pTVar11 < L->top) {
    bVar14 = L->base[2].tt - 3U < 4;
  }
  local_2270 = luaL_optinteger(L,4,local_2290 + 1);
  cVar1 = *pcVar6;
  if (!bVar14) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  pcVar6 = pcVar6 + (cVar1 == '^');
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2268.src_end = s + local_2290;
  iVar10 = 0;
  local_2280 = L;
  local_2278 = pcVar6;
  local_2268.src_init = s;
  local_2268.L = L;
  local_2048.L = L;
  do {
    if ((int)local_2270 <= iVar10) break;
    local_2268.level = 0;
    e = match(&local_2268,s,pcVar6);
    L_00 = local_2268.L;
    if (e != (char *)0x0) {
      pTVar11 = (local_2268.L)->top;
      pTVar9 = (local_2268.L)->base + 2;
      if (pTVar11 <= pTVar9) {
        pTVar9 = &luaO_nilobject_;
      }
      if (pTVar9 == &luaO_nilobject_) {
        iVar5 = -1;
      }
      else {
        iVar5 = pTVar9->tt;
      }
      iVar10 = iVar10 + 1;
      if (iVar5 - 3U < 2) {
        pcVar7 = lua_tolstring(local_2268.L,3,&local_2288);
        pcVar6 = local_2278;
        if (local_2288 != 0) {
          uVar12 = 0;
          do {
            if (pcVar7[uVar12] == '%') {
              uVar13 = uVar12 + 1;
              ppuVar8 = __ctype_b_loc();
              bVar2 = pcVar7[uVar12 + 1];
              if ((*(byte *)((long)*ppuVar8 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                   (iVar5 = emptybuffer(&local_2048), iVar5 != 0)) {
                  adjuststack(&local_2048);
                }
                *local_2048.p = pcVar7[uVar13];
                local_2048.p = local_2048.p + 1;
              }
              else if (bVar2 == 0x30) {
                luaL_addlstring(&local_2048,s,(long)e - (long)s);
              }
              else {
                push_onecapture(&local_2268,(char)bVar2 + -0x31,s,e);
                luaL_addvalue(&local_2048);
              }
            }
            else {
              if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                 (iVar5 = emptybuffer(&local_2048), iVar5 != 0)) {
                adjuststack(&local_2048);
              }
              *local_2048.p = pcVar7[uVar12];
              uVar13 = uVar12;
              local_2048.p = local_2048.p + 1;
            }
            uVar12 = uVar13 + 1;
            pcVar6 = local_2278;
          } while (uVar12 < local_2288);
        }
      }
      else {
        if (iVar5 == 5) {
          push_onecapture(&local_2268,0,s,e);
          pTVar11 = L_00->base + 2;
          if (L_00->top <= pTVar11) {
            pTVar11 = &luaO_nilobject_;
          }
          pTVar9 = L_00->top + -1;
          luaV_gettable(L_00,pTVar11,pTVar9,pTVar9);
        }
        else if (iVar5 == 6) {
          pTVar11->value = pTVar9->value;
          pTVar11->tt = pTVar9->tt;
          (local_2268.L)->top = (local_2268.L)->top + 1;
          uVar4 = push_captures(&local_2268,s,e);
          luaD_call(L_00,L_00->top + (int)~uVar4,1);
        }
        iVar5 = L_00->top[-1].tt;
        pTVar11 = L_00->top + -1;
        if (((long)iVar5 == 0) || ((iVar5 == 1 && ((pTVar11->value).b == 0)))) {
          L_00->top = pTVar11;
          lua_pushlstring(L_00,s,(long)e - (long)s);
        }
        else if ((pTVar11 == &luaO_nilobject_) || (iVar5 - 5U < 0xfffffffe)) {
          if (iVar5 == -1 || pTVar11 == &luaO_nilobject_) {
            pcVar6 = "no value";
          }
          else {
            pcVar6 = luaT_typenames[iVar5];
          }
          luaL_error(L_00,"invalid replacement value (a %s)",pcVar6);
        }
        luaL_addvalue(&local_2048);
      }
    }
    bVar14 = cVar1 != '^';
    if (e == (char *)0x0 || e <= s) {
      if (s < local_2268.src_end) {
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar5 = emptybuffer(&local_2048), iVar5 != 0)) {
          adjuststack(&local_2048);
        }
        *local_2048.p = *s;
        e = s + 1;
        local_2048.p = local_2048.p + 1;
      }
      else {
        bVar14 = false;
        e = s;
      }
    }
    s = e;
  } while (bVar14);
  luaL_addlstring(&local_2048,s,(long)local_2268.src_end - (long)s);
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  pTVar3 = local_2280->top;
  (pTVar3->value).n = (double)iVar10;
  pTVar3->tt = 3;
  local_2280->top = local_2280->top + 1;
  return 2;
}

Assistant:

static int str_gsub(lua_State*L){
size_t srcl;
const char*src=luaL_checklstring(L,1,&srcl);
const char*p=luaL_checkstring(L,2);
int tr=lua_type(L,3);
int max_s=luaL_optint(L,4,srcl+1);
int anchor=(*p=='^')?(p++,1):0;
int n=0;
MatchState ms;
luaL_Buffer b;
luaL_argcheck(L,tr==3||tr==4||
tr==6||tr==5,3,
"string/function/table expected");
luaL_buffinit(L,&b);
ms.L=L;
ms.src_init=src;
ms.src_end=src+srcl;
while(n<max_s){
const char*e;
ms.level=0;
e=match(&ms,src,p);
if(e){
n++;
add_value(&ms,&b,src,e);
}
if(e&&e>src)
src=e;
else if(src<ms.src_end)
luaL_addchar(&b,*src++);
else break;
if(anchor)break;
}
luaL_addlstring(&b,src,ms.src_end-src);
luaL_pushresult(&b);
lua_pushinteger(L,n);
return 2;
}